

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O1

Expression * __thiscall
soul::BlockBuilder::createIntegerChangedByOne(BlockBuilder *this,Expression *v,Op op)

{
  int iVar1;
  undefined4 extraout_var;
  Constant *args_2;
  BinaryOperator *pBVar2;
  CodeLocation local_b8;
  Value local_a8;
  Value local_68;
  
  iVar1 = (*(v->super_Object)._vptr_Object[2])(v);
  if ((((Type *)CONCAT44(extraout_var,iVar1))->primitiveType).type - int32 < 2) {
    soul::Value::Value(&local_a8,1);
    soul::Value::castToTypeExpectingSuccess
              (&local_68,&local_a8,(Type *)CONCAT44(extraout_var,iVar1));
    args_2 = createConstant(this,&local_68);
    soul::Value::~Value(&local_68);
    soul::Value::~Value(&local_a8);
    local_b8.sourceCode.object = (v->super_Object).location.sourceCode.object;
    if (local_b8.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_b8.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_b8.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_b8.location.data = (v->super_Object).location.location.data;
    local_a8.type._0_4_ = op;
    pBVar2 = PoolAllocator::
             allocate<soul::heart::BinaryOperator,soul::CodeLocation,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
                       (&this->module->allocator->pool,&local_b8,v,&args_2->super_Expression,
                        (Op *)&local_a8);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_b8.sourceCode.object);
    return &pBVar2->super_Expression;
  }
  throwInternalCompilerError("type.isInteger()","createIntegerChangedByOne",0xec);
}

Assistant:

heart::Expression& createIntegerChangedByOne (heart::Expression& v, BinaryOp::Op op)
    {
        const auto& type = v.getType();
        SOUL_ASSERT (type.isInteger());
        auto& one = createConstant (Value::createInt32 (1).castToTypeExpectingSuccess (type));
        return createBinaryOp (v.location, v, one, op);
    }